

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

HMODULE LoadLibraryExW(LPCWSTR lpLibFileName,HANDLE hFile,DWORD dwFlags)

{
  bool bVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  LPCWSTR local_88;
  HMODULE hModule;
  char *pcStack_78;
  INT name_length;
  CHAR *lpstr;
  HANDLE pVStack_68;
  DWORD dwFlags_local;
  HANDLE hFile_local;
  LPCWSTR lpLibFileName_local;
  undefined1 local_50 [8];
  PathCharString pathstr;
  
  pathstr.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  lpstr._4_4_ = dwFlags;
  pVStack_68 = hFile;
  hFile_local = lpLibFileName;
  if (dwFlags == 0) {
    StackString<32UL,_char>::StackString((StackString<32UL,_char> *)local_50);
    local_88 = (LPCWSTR)0x0;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    bVar1 = LOADVerifyLibraryPath<char16_t>((char16_t *)hFile_local);
    if (bVar1) {
      sVar2 = PAL_wcslen((char16_t *)hFile_local);
      pcStack_78 = StackString<32UL,_char>::OpenStringBuffer
                             ((StackString<32UL,_char> *)local_50,
                              (sVar2 + 1) * (long)MaxWCharToAcpLength);
      if ((pcStack_78 != (char *)0x0) &&
         (bVar1 = LOADConvertLibraryPathWideStringToMultibyteString
                            ((LPCWSTR)hFile_local,pcStack_78,(INT *)((long)&hModule + 4)), bVar1)) {
        FILEDosToUnixPathA(pcStack_78);
        StackString<32UL,_char>::CloseBuffer
                  ((StackString<32UL,_char> *)local_50,(long)hModule._4_4_);
        local_88 = (LPCWSTR)LOADLoadLibrary(pcStack_78,1);
      }
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    lpLibFileName_local = local_88;
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_50);
  }
  else {
    fprintf(_stderr,"] %s %s:%d","LoadLibraryExW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0xdd);
    fprintf(_stderr,"Needs Implementation!!!");
    lpLibFileName_local = (LPCWSTR)0x0;
  }
  if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != pathstr.m_count) {
    __stack_chk_fail();
  }
  return lpLibFileName_local;
}

Assistant:

HMODULE
PALAPI
LoadLibraryExW(
    IN LPCWSTR lpLibFileName,
    IN /*Reserved*/ HANDLE hFile,
    IN DWORD dwFlags)
{
    if (dwFlags != 0)
    {
        // UNIXTODO: Implement this!
        ASSERT("Needs Implementation!!!");
        return nullptr;
    }

    CHAR * lpstr;
    INT name_length;
    PathCharString pathstr;
    HMODULE hModule = nullptr;

    PERF_ENTRY(LoadLibraryExW);
    ENTRY("LoadLibraryExW (lpLibFileName=%p (%S)) \n",
          lpLibFileName ? lpLibFileName : W16_NULLSTRING,
          lpLibFileName ? lpLibFileName : W16_NULLSTRING);

    if (!LOADVerifyLibraryPath(lpLibFileName))
    {
        goto done;
    }

    lpstr = pathstr.OpenStringBuffer((PAL_wcslen(lpLibFileName)+1) * MaxWCharToAcpLength);
    if (nullptr == lpstr)
    {
        goto done;
    }
    if (!LOADConvertLibraryPathWideStringToMultibyteString(lpLibFileName, lpstr, &name_length))
    {
        goto done;
    }

    /* do the Dos/Unix conversion on our own copy of the name */
    FILEDosToUnixPathA(lpstr);
    pathstr.CloseBuffer(name_length);

    /* let LOADLoadLibrary call SetLastError in case of failure */
    hModule = LOADLoadLibrary(lpstr, TRUE);

done:
    LOGEXIT("LoadLibraryExW returns HMODULE %p\n", hModule);
    PERF_EXIT(LoadLibraryExW);
    return hModule;
}